

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcm.c
# Opt level: O0

uchar * mcmrealo(mcmcxdef *cctx,mcmon cliobj,ushort newsize)

{
  mcmon mVar1;
  int iVar2;
  size_t sVar3;
  mcmcx1def *ctx_00;
  ushort in_DX;
  ushort in_SI;
  long *in_RDI;
  errdef fr_;
  int local_lock;
  uchar *p;
  mcmodef *nxto;
  mcmon nxt;
  mcmodef *o;
  mcmon obj;
  mcmcx1def *ctx;
  undefined6 in_stack_fffffffffffffe48;
  mcmon in_stack_fffffffffffffe4e;
  undefined6 in_stack_fffffffffffffe50;
  mcmon in_stack_fffffffffffffe56;
  ushort uVar4;
  mcmcxdef *in_stack_fffffffffffffe58;
  uchar *puVar5;
  undefined8 in_stack_fffffffffffffe68;
  undefined4 uVar6;
  mcmcx1def *in_stack_fffffffffffffe70;
  mcmodef *local_188;
  errdef *in_stack_fffffffffffffe80;
  errdef *peVar7;
  uint in_stack_fffffffffffffe8c;
  ushort in_stack_fffffffffffffe96;
  erradef in_stack_fffffffffffffe98;
  __jmp_buf_tag _Stack_110;
  uint local_44;
  uchar *local_40;
  mcmodef *local_38;
  mcmon local_2a;
  mcmodef *local_28;
  ushort local_1a;
  mcmcx1def *local_18;
  ushort local_c;
  
  uVar6 = (undefined4)((ulong)in_stack_fffffffffffffe68 >> 0x20);
  local_18 = (mcmcx1def *)*in_RDI;
  local_1a = *(ushort *)(in_RDI[(long)((int)(uint)in_SI >> 8) + 6] + (long)(int)(in_SI & 0xff) * 2);
  local_28 = local_18->mcmcxtab[(int)(uint)local_1a >> 8] + (int)(local_1a & 0xff);
  sVar3 = osrndsz((ulong)in_DX);
  local_c = (ushort)sVar3;
  local_44 = (uint)(((local_28->mcmoflg & 4) != 0 ^ 0xffU) & 1);
  if (local_44 != 0) {
    mcmlck(in_stack_fffffffffffffe58,in_stack_fffffffffffffe56);
  }
  iVar2 = _setjmp(&_Stack_110);
  if (iVar2 != 0) {
    local_18->mcmcxerr->errcxptr = in_stack_fffffffffffffe80;
    if (local_44 != 0) {
      mcmunlck((mcmcxdef *)CONCAT26(in_stack_fffffffffffffe56,in_stack_fffffffffffffe50),
               in_stack_fffffffffffffe4e);
    }
    errrse1((errcxdef *)CONCAT26(in_stack_fffffffffffffe56,in_stack_fffffffffffffe50),
            (errdef *)CONCAT26(in_stack_fffffffffffffe4e,in_stack_fffffffffffffe48));
  }
  peVar7 = local_18->mcmcxerr->errcxptr;
  local_18->mcmcxerr->errcxptr = (errdef *)&stack0xfffffffffffffe80;
  if (local_c < local_28->mcmosiz) {
    mcmsplt(in_stack_fffffffffffffe70,(mcmon)((uint)uVar6 >> 0x10),(ushort)uVar6);
  }
  else {
    local_40 = local_28->mcmoptr;
    local_2a = *(mcmon *)(local_40 + (int)(uint)local_28->mcmosiz);
    if (local_2a == 0xffff) {
      local_188 = (mcmodef *)0x0;
    }
    else {
      local_188 = local_18->mcmcxtab[(int)(uint)local_2a >> 8] + (int)(local_2a & 0xff);
    }
    local_38 = local_188;
    if (((local_188 == (mcmodef *)0x0) || ((local_188->mcmoflg & 0x80) == 0)) ||
       ((int)(uint)local_188->mcmosiz < (int)((uint)local_c - (uint)local_28->mcmosiz))) {
      if (local_28->mcmolcnt != '\x01') {
        errsigf((errcxdef *)CONCAT26(in_stack_fffffffffffffe56,in_stack_fffffffffffffe50),
                (char *)CONCAT26(in_stack_fffffffffffffe4e,in_stack_fffffffffffffe48),0);
      }
      local_40 = mcmalo0((mcmcxdef *)in_stack_fffffffffffffe98.errastr,in_stack_fffffffffffffe96,
                         (mcmon *)((ulong)in_stack_fffffffffffffe8c << 0x20),
                         (mcmon)((ulong)peVar7 >> 0x30),(int)peVar7);
      if (local_2a == 0xffff) {
        errsigf((errcxdef *)CONCAT26(in_stack_fffffffffffffe56,in_stack_fffffffffffffe50),
                (char *)CONCAT26(in_stack_fffffffffffffe4e,in_stack_fffffffffffffe48),0);
      }
      memcpy(local_40,local_28->mcmoptr,(ulong)local_28->mcmosiz);
      local_38 = local_18->mcmcxtab[(int)(uint)local_2a >> 8] + (int)(local_2a & 0xff);
      local_c = local_38->mcmosiz;
      local_38->mcmoptr = local_28->mcmoptr;
      local_38->mcmosiz = local_28->mcmosiz;
      local_28->mcmoptr = local_40;
      local_28->mcmosiz = local_c;
      uVar4 = local_1a;
      puVar5 = local_40;
      sVar3 = osrndsz(2);
      mVar1 = local_2a;
      *(ushort *)(puVar5 + -sVar3) = uVar4;
      puVar5 = local_38->mcmoptr;
      sVar3 = osrndsz(2);
      *(mcmon *)(puVar5 + -sVar3) = mVar1;
      mcmgunlck((mcmcx1def *)CONCAT26(uVar4,in_stack_fffffffffffffe50),in_stack_fffffffffffffe4e);
      mcmgfre((mcmcx1def *)CONCAT26(uVar4,in_stack_fffffffffffffe50),in_stack_fffffffffffffe4e);
    }
    else {
      ctx_00 = (mcmcx1def *)(ulong)local_188->mcmosiz;
      sVar3 = osrndsz(2);
      local_28->mcmosiz = local_28->mcmosiz + (short)ctx_00 + (short)sVar3;
      mcmunl(local_18,local_2a,&local_18->mcmcxfre);
      local_38->mcmonxt = local_18->mcmcxunu;
      local_18->mcmcxunu = local_2a;
      local_38->mcmoflg = 0;
      mcmsplt(ctx_00,(mcmon)((uint)uVar6 >> 0x10),(ushort)uVar6);
    }
  }
  local_18->mcmcxerr->errcxptr = peVar7;
  return local_28->mcmoptr;
}

Assistant:

uchar *mcmrealo(mcmcxdef *cctx, mcmon cliobj, ushort newsize)
{
    mcmcx1def *ctx = cctx->mcmcxgl;                       /* global context */
    mcmon      obj = mcmc2g(cctx, cliobj); 
    mcmodef   *o = mcmgobje(ctx, obj);
    mcmon      nxt;
    mcmodef   *nxto;
    uchar     *p;
    int        local_lock;
    
    MCMCLICTX(cctx);
    MCMGLBCTX(ctx);
    
    newsize = osrndsz(newsize);
    
    /* make sure the object is locked, and note if we locked it */
    if ((local_lock = !(o->mcmoflg & MCMOFLOCK)) != 0)
        (void)mcmlck(cctx, cliobj);
    
    ERRBEGIN(ctx->mcmcxerr)
    
    if (newsize < o->mcmosiz)
        mcmsplt(ctx, obj, newsize);            /* smaller; just split block */
    else
    {
        /* see if there's a free block after this block */
        p = o->mcmoptr;
        nxt = *(mcmon *)(p + o->mcmosiz);
        nxto = (nxt == MCMONINV) ? (mcmodef *)0 : mcmgobje(ctx, nxt);
        
        if (nxto && ((nxto->mcmoflg & MCMOFFREE)
                     && nxto->mcmosiz >= newsize - o->mcmosiz))
        {
            /* sanity check - make sure heap and page table agree */
            assert(nxto->mcmoptr == p + o->mcmosiz + osrndsz(sizeof(mcmon)));
            /* annex the free block */
            o->mcmosiz += nxto->mcmosiz + osrndsz(sizeof(mcmon));
            /* move the free block to the unused list */
            mcmunl(ctx, nxt, &ctx->mcmcxfre);
            nxto->mcmonxt = ctx->mcmcxunu;
            ctx->mcmcxunu = nxt;
            nxto->mcmoflg = 0;
            
            /* split the newly grown block if necessary */
            mcmsplt(ctx, obj, newsize);
        }
        else
        {
            /* can't annex; allocate new memory and copy */
            
            if (o->mcmolcnt != 1)           /* if anyone else has a lock... */
                errsig(ctx->mcmcxerr, ERR_REALCK);      /* we can't move it */
    
            p = mcmalo0(cctx, newsize, &nxt, MCMONINV, TRUE);
            if (nxt == MCMONINV) errsig(ctx->mcmcxerr, ERR_NOMEM2);
            memcpy(p, o->mcmoptr, (size_t)o->mcmosiz);
            
            /* adjust the object entries */
            nxto = mcmgobje(ctx, nxt);          /* get pointer to new entry */
            newsize = nxto->mcmosiz;        /* get actual size of new block */
            nxto->mcmoptr = o->mcmoptr;   /* copy current block info to new */
            nxto->mcmosiz = o->mcmosiz;
            o->mcmoptr = p;        /* copy new block info to original entry */
            o->mcmosiz = newsize;
            
            /* now fix up the heap pointers, and free the temp object */
            *(mcmon *)(p - osrndsz(sizeof(mcmon))) = obj;
            *(mcmon *)(nxto->mcmoptr - osrndsz(sizeof(mcmon))) = nxt;
            mcmgunlck(ctx, nxt);
            mcmgfre(ctx, nxt);
        }
    }
    
    ERRCLEAN(ctx->mcmcxerr)
        /* release our lock, if we had to obtain one */
        if (local_lock) mcmunlck(cctx, cliobj);
    ERRENDCLN(ctx->mcmcxerr)
    
    /* return the address of the object */
    return(o->mcmoptr);
}